

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O2

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doLocalSet(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  uint uVar1;
  pointer pSVar2;
  LocalSet *pLVar3;
  reference rVar4;
  uint local_24 [2];
  Index index;
  
  pLVar3 = Expression::cast<wasm::LocalSet>(*currp);
  uVar1 = pLVar3->index;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&self->localsSet,(ulong)uVar1);
  if ((*rVar4._M_p & rVar4._M_mask) == 0) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&self->localsSet,(ulong)uVar1);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    pSVar2 = (self->cleanupStack).
             super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((self->cleanupStack).
        super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pSVar2) {
      SmallVector<unsigned_int,_5UL>::push_back(pSVar2 + -1,local_24);
    }
  }
  return;
}

Assistant:

static void doLocalSet(Scanner* self, Expression** currp) {
      auto index = (*currp)->cast<LocalSet>()->index;
      if (!self->localsSet[index]) {
        // This local is now set until the end of this scope.
        self->localsSet[index] = true;
        // If we are not in the topmost scope, note this for later cleanup.
        if (!self->cleanupStack.empty()) {
          self->cleanupStack.back().push_back(index);
        }
      }
    }